

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnresolvedEnergyDependent.test.cpp
# Opt level: O3

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 6.795900-1          0          0          2          03843 2151     \n 8.913540+1 0.000000+0          0          0          1          03843 2151     \n 5.000000-1 0.000000+0          5          0         18          23843 2151     \n 0.000000+0 0.000000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+03843 2151     \n 6.000000+3 1.240600+4 0.000000+0 4.590100-1 2.050000-1 0.000000+03843 2151     \n 8.000000+3 1.240600+4 1.000000-1 4.590100-1 2.051000-1 0.000000+03843 2151     \n 8.913540+1 0.000000+0          1          0          2          03843 2151     \n 5.000000-1 0.000000+0          5          0         24          33843 2151     \n 0.000000+0 0.000000+0 4.000000+0 3.000000+0 2.000000+0 1.000000+03843 2151     \n 6.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n 7.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n 8.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n 1.500000+0 0.000000+0          5          0         18          23843 2151     \n 0.000000+0 0.000000+0 0.000000+0 1.000000+0 4.000000+0 2.000000+03843 2151     \n 6.000000+3 6.202800+3 0.000000+0 3.361900+0 2.050000-1 0.000000+03843 2151     \n 8.000000+3 6.202800+3 0.000000+0 3.361900+0 2.050000-1 0.000000+03843 2151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunk() {
  return
    " 0.000000+0 6.795900-1          0          0          2          03843 2151     \n"
    // L=0
    " 8.913540+1 0.000000+0          0          0          1          03843 2151     \n"
    // L=0 J=0.5
    " 5.000000-1 0.000000+0          5          0         18          23843 2151     \n"
    " 0.000000+0 0.000000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+03843 2151     \n"
    " 6.000000+3 1.240600+4 0.000000+0 4.590100-1 2.050000-1 0.000000+03843 2151     \n"
    " 8.000000+3 1.240600+4 1.000000-1 4.590100-1 2.051000-1 0.000000+03843 2151     \n"
    // L=1
    " 8.913540+1 0.000000+0          1          0          2          03843 2151     \n"
    // L=1 J=0.5
    " 5.000000-1 0.000000+0          5          0         24          33843 2151     \n"
    " 0.000000+0 0.000000+0 4.000000+0 3.000000+0 2.000000+0 1.000000+03843 2151     \n"
    " 6.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n"
    " 7.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n"
    " 8.000000+3 1.240600+4 0.000000+0 6.723800+0 2.050000-1 0.000000+03843 2151     \n"
    // L=1 J=1.5
    " 1.500000+0 0.000000+0          5          0         18          23843 2151     \n"
    " 0.000000+0 0.000000+0 0.000000+0 1.000000+0 4.000000+0 2.000000+03843 2151     \n"
    " 6.000000+3 6.202800+3 0.000000+0 3.361900+0 2.050000-1 0.000000+03843 2151     \n"
    " 8.000000+3 6.202800+3 0.000000+0 3.361900+0 2.050000-1 0.000000+03843 2151     \n";
}